

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_init_encoder_ppmd
              (archive *a,la_zstream_conflict *lastrm,uint maxOrder,uint32_t msize)

{
  Bool BVar1;
  undefined4 *__ptr;
  void *pvVar2;
  uint8_t *__ptr_00;
  int r;
  uint8_t *props;
  ppmd_stream *strm;
  uint32_t msize_local;
  uint maxOrder_local;
  la_zstream_conflict *lastrm_local;
  archive *a_local;
  
  if (lastrm->valid != 0) {
    compression_end(a,lastrm);
  }
  __ptr = (undefined4 *)calloc(1,0x4b48);
  if (__ptr == (undefined4 *)0x0) {
    archive_set_error(a,0xc,"Can\'t allocate memory for PPMd");
    a_local._4_4_ = -0x1e;
  }
  else {
    pvVar2 = malloc(0x20);
    *(void **)(__ptr + 0x12ca) = pvVar2;
    if (*(long *)(__ptr + 0x12ca) == 0) {
      free(__ptr);
      archive_set_error(a,0xc,"Can\'t allocate memory for PPMd");
      a_local._4_4_ = -0x1e;
    }
    else {
      *(undefined8 *)(__ptr + 0x12cc) = *(undefined8 *)(__ptr + 0x12ca);
      *(long *)(__ptr + 0x12ce) = *(long *)(__ptr + 0x12ca) + 0x20;
      __ptr_00 = (uint8_t *)malloc(5);
      if (__ptr_00 == (uint8_t *)0x0) {
        free(*(void **)(__ptr + 0x12ca));
        free(__ptr);
        archive_set_error(a,0xc,"Coludn\'t allocate memory for PPMd");
        a_local._4_4_ = -0x1e;
      }
      else {
        *__ptr_00 = (uint8_t)maxOrder;
        archive_le32enc(__ptr_00 + 1,msize);
        Ppmd7_Construct((CPpmd7 *)(__ptr + 2));
        BVar1 = Ppmd7_Alloc((CPpmd7 *)(__ptr + 2),msize);
        if (BVar1 == 0) {
          free(*(void **)(__ptr + 0x12ca));
          free(__ptr);
          free(__ptr_00);
          archive_set_error(a,0xc,"Coludn\'t allocate memory for PPMd");
          a_local._4_4_ = -0x1e;
        }
        else {
          Ppmd7_Init((CPpmd7 *)(__ptr + 2),maxOrder);
          *(archive **)(__ptr + 0x12c6) = a;
          *(code **)(__ptr + 0x12c8) = ppmd_write;
          *(undefined4 **)(__ptr + 0x12c4) = __ptr + 0x12c6;
          Ppmd7z_RangeEnc_Init((CPpmd7z_RangeEnc *)(__ptr + 0x12be));
          *__ptr = 0;
          lastrm->real_stream = __ptr;
          lastrm->valid = 1;
          lastrm->code = compression_code_ppmd;
          lastrm->end = compression_end_ppmd;
          lastrm->prop_size = 5;
          lastrm->props = __ptr_00;
          a_local._4_4_ = 0;
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
compression_init_encoder_ppmd(struct archive *a,
    struct la_zstream *lastrm, unsigned maxOrder, uint32_t msize)
{
	struct ppmd_stream *strm;
	uint8_t *props;
	int r;

	if (lastrm->valid)
		compression_end(a, lastrm);
	strm = calloc(1, sizeof(*strm));
	if (strm == NULL) {
		archive_set_error(a, ENOMEM,
		    "Can't allocate memory for PPMd");
		return (ARCHIVE_FATAL);
	}
	strm->buff = malloc(32);
	if (strm->buff == NULL) {
		free(strm);
		archive_set_error(a, ENOMEM,
		    "Can't allocate memory for PPMd");
		return (ARCHIVE_FATAL);
	}
	strm->buff_ptr = strm->buff;
	strm->buff_end = strm->buff + 32;

	props = malloc(1+4);
	if (props == NULL) {
		free(strm->buff);
		free(strm);
		archive_set_error(a, ENOMEM,
		    "Coludn't allocate memory for PPMd");
		return (ARCHIVE_FATAL);
	}
	props[0] = maxOrder;
	archive_le32enc(props+1, msize);
	__archive_ppmd7_functions.Ppmd7_Construct(&strm->ppmd7_context);
	r = __archive_ppmd7_functions.Ppmd7_Alloc(
		&strm->ppmd7_context, msize);
	if (r == 0) {
		free(strm->buff);
		free(strm);
		free(props);
		archive_set_error(a, ENOMEM,
		    "Coludn't allocate memory for PPMd");
		return (ARCHIVE_FATAL);
	}
	__archive_ppmd7_functions.Ppmd7_Init(&(strm->ppmd7_context), maxOrder);
	strm->byteout.a = (struct archive_write *)a;
	strm->byteout.Write = ppmd_write;
	strm->range_enc.Stream = &(strm->byteout);
	__archive_ppmd7_functions.Ppmd7z_RangeEnc_Init(&(strm->range_enc));
	strm->stat = 0;

	lastrm->real_stream = strm;
	lastrm->valid = 1;
	lastrm->code = compression_code_ppmd;
	lastrm->end = compression_end_ppmd;
	lastrm->prop_size = 5;
	lastrm->props = props;
	return (ARCHIVE_OK);
}